

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O0

Status * draco::PointCloudDecoder::DecodeHeader(DecoderBuffer *buffer,DracoHeader *out_header)

{
  bool bVar1;
  int iVar2;
  void *in_RDX;
  Status *in_RDI;
  char kIoErrorMsg [30];
  size_t in_stack_fffffffffffffe58;
  Code CVar3;
  Status *in_stack_fffffffffffffe60;
  Status *this;
  DecoderBuffer *in_stack_fffffffffffffe68;
  Status *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  string local_158 [39];
  undefined1 local_131 [40];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  char local_38 [32];
  void *local_18;
  
  builtin_strncpy(local_38,"Failed to parse Draco header.",0x1e);
  __s = in_RDI;
  local_18 = in_RDX;
  bVar1 = DecoderBuffer::Decode
                    (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  CVar3 = (Code)(in_stack_fffffffffffffe58 >> 0x20);
  if (bVar1) {
    iVar2 = memcmp(local_18,"DRACO",5);
    if (iVar2 == 0) {
      bVar1 = DecoderBuffer::Decode<unsigned_char>
                        (in_stack_fffffffffffffe68,(uchar *)in_stack_fffffffffffffe60);
      if (bVar1) {
        bVar1 = DecoderBuffer::Decode<unsigned_char>
                          (in_stack_fffffffffffffe68,(uchar *)in_stack_fffffffffffffe60);
        if (bVar1) {
          bVar1 = DecoderBuffer::Decode<unsigned_char>
                            (in_stack_fffffffffffffe68,(uchar *)in_stack_fffffffffffffe60);
          if (bVar1) {
            bVar1 = DecoderBuffer::Decode<unsigned_char>
                              (in_stack_fffffffffffffe68,(uchar *)in_stack_fffffffffffffe60);
            if (bVar1) {
              bVar1 = DecoderBuffer::Decode<unsigned_short>
                                (in_stack_fffffffffffffe68,
                                 (unsigned_short *)in_stack_fffffffffffffe60);
              if (bVar1) {
                OkStatus();
              }
              else {
                CVar3 = (Code)((ulong)&stack0xfffffffffffffea7 >> 0x20);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffea0,(char *)__s,(allocator<char> *)in_RDI);
                Status::Status(in_stack_fffffffffffffe60,CVar3,(string *)0x182d2c);
                std::__cxx11::string::~string(local_158);
                std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea7);
              }
            }
            else {
              this = (Status *)local_131;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffea0,(char *)__s,(allocator<char> *)in_RDI);
              Status::Status(this,CVar3,(string *)0x182c73);
              std::__cxx11::string::~string((string *)(local_131 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_131);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffea0,(char *)__s,(allocator<char> *)in_RDI);
            Status::Status(in_stack_fffffffffffffe60,CVar3,(string *)0x182bac);
            std::__cxx11::string::~string(local_108);
            std::allocator<char>::~allocator(&local_109);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffea0,(char *)__s,(allocator<char> *)in_RDI);
          Status::Status(in_stack_fffffffffffffe60,CVar3,(string *)0x182adc);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator(&local_e1);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffea0,(char *)__s,(allocator<char> *)in_RDI);
        Status::Status(in_stack_fffffffffffffe60,CVar3,(string *)0x182a0c);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator(&local_b9);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffea0,(char *)__s,(allocator<char> *)in_RDI);
      Status::Status(in_stack_fffffffffffffe60,CVar3,(string *)0x18293c);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator(&local_91);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea0,(char *)__s,(allocator<char> *)in_RDI);
    Status::Status(in_stack_fffffffffffffe60,CVar3,(string *)0x18286c);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  return __s;
}

Assistant:

Status PointCloudDecoder::DecodeHeader(DecoderBuffer *buffer,
                                       DracoHeader *out_header) {
  constexpr char kIoErrorMsg[] = "Failed to parse Draco header.";
  if (!buffer->Decode(out_header->draco_string, 5)) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (memcmp(out_header->draco_string, "DRACO", 5) != 0) {
    return Status(Status::DRACO_ERROR, "Not a Draco file.");
  }
  if (!buffer->Decode(&(out_header->version_major))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->version_minor))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->encoder_type))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->encoder_method))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->flags))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  return OkStatus();
}